

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O0

void __thiscall nvtt::OutputOptions::setFileName(OutputOptions *this,char *fileName)

{
  Path local_28;
  char *local_18;
  char *fileName_local;
  OutputOptions *this_local;
  
  local_18 = fileName;
  fileName_local = (char *)this;
  nv::Path::Path(&local_28,fileName);
  nv::Path::operator=(&this->m->fileName,&local_28);
  nv::Path::~Path(&local_28);
  this->m->outputHandler = (OutputHandler *)0x0;
  return;
}

Assistant:

void OutputOptions::setFileName(const char * fileName)
{
	m.fileName = fileName;
	m.outputHandler = NULL;
}